

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void scm_clear(void)

{
  cell_map local_28;
  
  scm_stop();
  cell_map::cell_map(&local_28,width,height);
  grid.width = local_28.width;
  grid.height = local_28.height;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&grid.cells,&local_28.cells);
  if (local_28.cells.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.cells.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.cells.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.cells.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  paint_grid();
  return;
}

Assistant:

void scm_clear()
  {
  scm_stop();
  grid = cell_map(width, height);
  paint_grid();
  }